

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O1

void __thiscall
coinscachepair_tests::linked_list_iteration::test_method(linked_list_iteration *this)

{
  long lVar1;
  CoinsCachePair *pCVar2;
  CoinsCachePair *sentinel_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  _List_node_base *p_Var5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  CoinsCachePair *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CoinsCachePair *local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  CoinsCachePair *local_140;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair **local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  CoinsCachePair ***local_100;
  CoinsCachePair **local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  CoinsCachePair ***local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sentinel.first.n = 0xffffffff;
  sentinel.second.m_prev = (CoinsCachePair *)0x0;
  sentinel.second.m_next = (CoinsCachePair *)0x0;
  sentinel.second.m_flags = '\0';
  sentinel.second._17_7_ = 0;
  sentinel.second.coin.out.nValue = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  sentinel.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&sentinel.second);
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_next = sentinel.second.m_prev;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)sentinel.second.m_prev,sentinel_00);
  local_140 = sentinel.second.m_next;
  p_Var5 = nodes.
           super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
    do {
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_148 = "";
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x2d;
      file.m_begin = (iterator)&local_150;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg)
      ;
      local_188 = (CoinsCachePair *)(p_Var5 + 1);
      local_180.m_empty = false;
      local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_170 = boost::unit_test::lazy_ostream::inst;
      local_168 = "";
      local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_188 == local_140);
      local_c0.m_message.px = (element_type *)0x0;
      local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_c8 = "";
      local_f8 = &local_188;
      local_e8 = 0;
      local_f0 = &PTR__lazy_ostream_013d5400;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = &local_f8;
      local_120 = &local_140;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013d53c0;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_100 = &local_120;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_c0,&local_180,1,2,REQUIRE,0xe998e0,(size_t)&local_d0,0x2d,&local_f0,"node",
                 &local_118);
      boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
      local_140 = (local_140->second).m_next;
      p_Var5 = (((_List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)&nodes);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x30;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  local_188 = &sentinel;
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_120 = &local_188;
  local_f8 = &local_140;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_140 == local_188);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_f8;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_110 = 0;
  local_100 = &local_120;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xff464e,(size_t)&local_d0,0x30,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_140 = sentinel.second.m_next;
  if (nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
    p_Var5 = nodes.
             super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      local_1b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_1b0 = "";
      local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x36;
      file_01.m_begin = (iterator)&local_1b8;
      msg_01.m_end = pvVar4;
      msg_01.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
                 msg_01);
      local_188 = (CoinsCachePair *)(p_Var5 + 1);
      local_180.m_empty = false;
      local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_170 = boost::unit_test::lazy_ostream::inst;
      local_168 = "";
      local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_188 == local_140);
      local_c0.m_message.px = (element_type *)0x0;
      local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_c8 = "";
      local_f8 = &local_188;
      local_e8 = 0;
      local_f0 = &PTR__lazy_ostream_013d5400;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = &local_f8;
      local_120 = &local_140;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013d53c0;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_100 = &local_120;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_c0,&local_180,1,2,REQUIRE,0xe998e0,(size_t)&local_d0,0x36,&local_f0,"node",
                 &local_118);
      boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
      pCVar2 = (local_140->second).m_next;
      if ((local_140->second).m_flags != '\0') {
        (pCVar2->second).m_prev = (local_140->second).m_prev;
        (((local_140->second).m_prev)->second).m_next = pCVar2;
        (local_140->second).m_flags = '\0';
      }
      p_Var5 = (((_List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_140 = pCVar2;
    } while (p_Var5 != (_List_node_base *)&nodes);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3b;
  file_02.m_begin = (iterator)&local_1d8;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_140 == &sentinel);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_140;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_188;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_188 = &sentinel;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xff464e,(size_t)&local_d0,0x3b,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3d;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = sentinel.second.m_next;
  local_120 = &local_210;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sentinel.second.m_next == &sentinel);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_188;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_210 = &sentinel;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xe998ea,(size_t)&local_d0,0x3d,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3e;
  file_04.m_begin = (iterator)&local_220;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
             msg_04);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = sentinel.second.m_prev;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sentinel.second.m_prev == &sentinel);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_188;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_210;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_210 = &sentinel;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xe99863,(size_t)&local_d0,0x3e,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  if (nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
    do {
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_238 = "";
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x42;
      file_05.m_begin = (iterator)&local_240;
      msg_05.m_end = pvVar4;
      msg_05.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_250,
                 msg_05);
      local_180.m_empty = false;
      local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_170 = boost::unit_test::lazy_ostream::inst;
      local_168 = "";
      local_210 = (CoinsCachePair *)
                  CONCAT71(local_210._1_7_,
                           *(char *)&nodes.
                                     super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev);
      local_188 = (CoinsCachePair *)((ulong)local_188 & 0xffffffff00000000);
      local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (*(char *)&nodes.
                      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev == '\0');
      local_c0.m_message.px = (element_type *)0x0;
      local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_c8 = "";
      local_f8 = &local_210;
      local_e8 = 0;
      local_f0 = &PTR__lazy_ostream_013d4aa0;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = &local_f8;
      local_120 = &local_188;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013d3e70;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_100 = &local_120;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_c0,&local_180,1,2,REQUIRE,0xe99901,(size_t)&local_d0,0x42,&local_f0,"0",
                 &local_118);
      boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
      p_Var5 = (nodes.
                super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      std::__cxx11::
      list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ::_M_erase(&nodes,(iterator)
                        nodes.
                        super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next);
      nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var5;
    } while (p_Var5 != (_List_node_base *)&nodes);
  }
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  pCVar2 = sentinel.second.m_next;
  if (sentinel.second.m_flags != '\0') {
    ((sentinel.second.m_next)->second).m_prev = sentinel.second.m_prev;
    ((sentinel.second.m_prev)->second).m_next = pCVar2;
    sentinel.second._16_8_ = sentinel.second._16_8_ & 0xffffffffffffff00;
  }
  if (0x1c < sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_iteration)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Check iterating through pairs is identical to iterating through a list
    auto node{sentinel.second.Next()};
    for (const auto& expected : nodes) {
        BOOST_CHECK_EQUAL(&expected, node);
        node = node->second.Next();
    }
    BOOST_CHECK_EQUAL(node, &sentinel);

    // Check iterating through pairs is identical to iterating through a list
    // Clear the flags during iteration
    node = sentinel.second.Next();
    for (const auto& expected : nodes) {
        BOOST_CHECK_EQUAL(&expected, node);
        auto next = node->second.Next();
        node->second.ClearFlags();
        node = next;
    }
    BOOST_CHECK_EQUAL(node, &sentinel);
    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);

    // Delete the nodes from the list to make sure there are no dangling pointers
    for (auto it{nodes.begin()}; it != nodes.end(); it = nodes.erase(it)) {
        BOOST_CHECK_EQUAL(it->second.GetFlags(), 0);
    }
}